

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

xmlParserErrors
xmlFindExtraHandler(char *norig,char *name,xmlCharEncFlags flags,xmlCharEncConvImpl impl,
                   void *implCtxt,xmlCharEncodingHandler **out)

{
  xmlCharEncodingHandlerPtr pxVar1;
  xmlParserErrors xVar2;
  xmlParserErrors xVar3;
  int iVar4;
  char *pcVar5;
  undefined8 *vctxt;
  undefined8 *vctxt_00;
  iconv_t pvVar6;
  int *piVar7;
  code *output;
  code *input;
  long lVar8;
  
  if (impl != (xmlCharEncConvImpl)0x0) {
    xVar3 = (*impl)(implCtxt,norig,flags,out);
    return xVar3;
  }
  if (globalHandlers != (xmlCharEncodingHandlerPtr *)0x0) {
    for (lVar8 = 0; lVar8 < nbCharEncodingHandler; lVar8 = lVar8 + 1) {
      pxVar1 = globalHandlers[lVar8];
      iVar4 = xmlStrcasecmp((xmlChar *)name,(xmlChar *)pxVar1->name);
      if (((iVar4 == 0) &&
          (((flags & XML_ENC_INPUT) == 0 || ((pxVar1->input).func != (xmlCharEncConvFunc)0x0)))) &&
         (((flags & XML_ENC_OUTPUT) == 0 || ((pxVar1->output).func != (xmlCharEncConvFunc)0x0)))) {
        *out = pxVar1;
        return XML_ERR_OK;
      }
    }
  }
  pcVar5 = strstr(name,"//");
  if (pcVar5 != (char *)0x0) {
    return XML_ERR_UNSUPPORTED_ENCODING;
  }
  if ((flags & XML_ENC_INPUT) == 0) {
    vctxt = (undefined8 *)0x0;
    input = (xmlCharEncConvFunc)0x0;
LAB_0012988f:
    if ((flags & XML_ENC_OUTPUT) == 0) {
      output = (xmlCharEncConvFunc)0x0;
      vctxt_00 = (undefined8 *)0x0;
LAB_001298d5:
      xVar3 = xmlCharEncNewCustomHandler(name,input,output,xmlIconvFree,vctxt,vctxt_00,out);
      return xVar3;
    }
    vctxt_00 = (undefined8 *)(*xmlMalloc)(8);
    if (vctxt_00 == (undefined8 *)0x0) {
      xVar3 = XML_ERR_NO_MEMORY;
    }
    else {
      *vctxt_00 = 0xffffffffffffffff;
      pvVar6 = iconv_open(name,"UTF-8");
      if (pvVar6 != (iconv_t)0xffffffffffffffff) {
        *vctxt_00 = pvVar6;
        output = xmlIconvConvert;
        goto LAB_001298d5;
      }
      piVar7 = __errno_location();
      xVar2 = XML_ERR_SYSTEM;
      if (*piVar7 == 0xc) {
        xVar2 = XML_ERR_NO_MEMORY;
      }
      xVar3 = XML_ERR_UNSUPPORTED_ENCODING;
      if (*piVar7 != 0x16) {
        xVar3 = xVar2;
      }
    }
    if (vctxt == (undefined8 *)0x0) goto LAB_00129949;
  }
  else {
    vctxt = (undefined8 *)(*xmlMalloc)(8);
    if (vctxt == (undefined8 *)0x0) {
      return XML_ERR_NO_MEMORY;
    }
    *vctxt = 0xffffffffffffffff;
    pvVar6 = iconv_open("UTF-8",name);
    if (pvVar6 != (iconv_t)0xffffffffffffffff) {
      *vctxt = pvVar6;
      input = xmlIconvConvert;
      goto LAB_0012988f;
    }
    piVar7 = __errno_location();
    if (*piVar7 == 0x16) {
      xVar3 = XML_ERR_UNSUPPORTED_ENCODING;
    }
    else if (*piVar7 == 0xc) {
      xVar3 = XML_ERR_NO_MEMORY;
    }
    else {
      xVar3 = XML_ERR_SYSTEM;
    }
    vctxt_00 = (undefined8 *)0x0;
  }
  xmlIconvFree(vctxt);
LAB_00129949:
  if (vctxt_00 != (undefined8 *)0x0) {
    xmlIconvFree(vctxt_00);
  }
  return xVar3;
}

Assistant:

static xmlParserErrors
xmlFindExtraHandler(const char *norig, const char *name, xmlCharEncFlags flags,
                    xmlCharEncConvImpl impl, void *implCtxt,
                    xmlCharEncodingHandler **out) {
    /*
     * Try custom implementation before deprecated global handlers.
     *
     * Note that we pass the original name without deprecated
     * alias resolution.
     */
    if (impl != NULL)
        return(impl(implCtxt, norig, flags, out));

    /*
     * Deprecated
     */
    if (globalHandlers != NULL) {
        int i;

        for (i = 0; i < nbCharEncodingHandler; i++) {
            xmlCharEncodingHandler *h = globalHandlers[i];

            if (!xmlStrcasecmp((const xmlChar *) name,
                               (const xmlChar *) h->name)) {
                if ((((flags & XML_ENC_INPUT) == 0) || (h->input.func)) &&
                    (((flags & XML_ENC_OUTPUT) == 0) || (h->output.func))) {
                    *out = h;
                    return(XML_ERR_OK);
                }
            }
        }
    }

#ifdef LIBXML_ICONV_ENABLED
    {
        int ret = xmlCharEncIconv(name, flags, out);

        if (ret == XML_ERR_OK)
            return(XML_ERR_OK);
        if (ret != XML_ERR_UNSUPPORTED_ENCODING)
            return(ret);
    }
#endif /* LIBXML_ICONV_ENABLED */

#ifdef LIBXML_ICU_ENABLED
    {
        int ret = xmlCharEncUconv(name, flags, out);

        if (ret == XML_ERR_OK)
            return(XML_ERR_OK);
        if (ret != XML_ERR_UNSUPPORTED_ENCODING)
            return(ret);
    }
#endif /* LIBXML_ICU_ENABLED */

    return(XML_ERR_UNSUPPORTED_ENCODING);
}